

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partitioned_tuple_data.cpp
# Opt level: O2

string * __thiscall
duckdb::PartitionedTupleData::ToString_abi_cxx11_
          (string *__return_storage_ptr__,PartitionedTupleData *this)

{
  pointer this_00;
  ulong params;
  unsigned_long in_R8;
  long lVar1;
  allocator local_d9;
  string *local_d8;
  string local_d0;
  Exception local_b0 [2];
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  ::std::__cxx11::string::string
            ((string *)local_b0,"PartitionedTupleData - [%llu Partitions, %llu Rows]\n",
             (allocator *)&local_70);
  local_d8 = __return_storage_ptr__;
  Exception::ConstructMessage<unsigned_long,unsigned_long>
            (__return_storage_ptr__,local_b0,
             (string *)
             ((long)(this->partitions).
                    super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->partitions).
                    super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                    .
                    super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3),this->count,in_R8);
  ::std::__cxx11::string::~string((string *)local_b0);
  lVar1 = 0;
  for (params = 0;
      params < (ulong)((long)(this->partitions).
                             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->partitions).
                             super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             .
                             super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3); params = params + 1) {
    ::std::__cxx11::string::string((string *)&local_90,"Partition %llu: ",&local_d9);
    Exception::ConstructMessage<unsigned_long>(&local_d0,&local_90,params);
    this_00 = unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
              ::operator->((unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>
                            *)((long)&(((this->partitions).
                                        super_vector<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                        .
                                        super__Vector_base<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>,_true>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super_unique_ptr<duckdb::TupleDataCollection,_std::default_delete<duckdb::TupleDataCollection>_>
                                      )._M_t + lVar1));
    TupleDataCollection::ToString_abi_cxx11_(&local_50,this_00);
    ::std::operator+(&local_70,&local_d0,&local_50);
    ::std::__cxx11::string::append((string *)local_d8);
    ::std::__cxx11::string::~string((string *)&local_70);
    ::std::__cxx11::string::~string((string *)&local_50);
    ::std::__cxx11::string::~string((string *)&local_d0);
    ::std::__cxx11::string::~string((string *)&local_90);
    lVar1 = lVar1 + 8;
  }
  return local_d8;
}

Assistant:

string PartitionedTupleData::ToString() {
	string result =
	    StringUtil::Format("PartitionedTupleData - [%llu Partitions, %llu Rows]\n", partitions.size(), Count());
	for (idx_t partition_idx = 0; partition_idx < partitions.size(); partition_idx++) {
		result += StringUtil::Format("Partition %llu: ", partition_idx) + partitions[partition_idx]->ToString();
	}
	return result;
}